

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NamedStructurePatternMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedStructurePatternMemberSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PatternSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,PatternSyntax *args_2)

{
  Token colon;
  Token name;
  NamedStructurePatternMemberSyntax *pNVar1;
  Info *in_RCX;
  long in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pNVar1 = (NamedStructurePatternMemberSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  name.info = in_RSI;
  name.kind = (short)in_RDX;
  name._2_1_ = (char)((ulong)in_RDX >> 0x10);
  name.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  name.rawLen = (int)((ulong)in_RDX >> 0x20);
  colon.info = in_RCX;
  colon._0_8_ = in_RSI->location;
  slang::syntax::NamedStructurePatternMemberSyntax::NamedStructurePatternMemberSyntax
            ((NamedStructurePatternMemberSyntax *)in_RSI->rawTextPtr,name,colon,
             *(PatternSyntax **)(in_RDX + 8));
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }